

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_sudoku.cpp
# Opt level: O0

void __thiscall
TrainSudoku::addTrainDependencies
          (TrainSudoku *this,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *a,set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *b)

{
  size_t *psVar1;
  bool bVar2;
  element_type *peVar3;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> local_138;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_108;
  shared_ptr<Field> *fieldB;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *__range1_1;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_b8;
  shared_ptr<Field> *fieldA;
  iterator __end1;
  iterator __begin1;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *__range1;
  undefined1 local_88 [8];
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> bFields;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> aFields;
  anon_class_8_1_8991fb9c toFieldSet;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *b_local;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *a_local;
  TrainSudoku *this_local;
  
  psVar1 = &aFields._M_t._M_impl.super__Rb_tree_header._M_node_count;
  aFields._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  addTrainDependencies::anon_class_8_1_8991fb9c::operator()
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )&bFields._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (anon_class_8_1_8991fb9c *)psVar1,a);
  addTrainDependencies::anon_class_8_1_8991fb9c::operator()
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )local_88,(anon_class_8_1_8991fb9c *)psVar1,b);
  psVar1 = &bFields._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
           ::begin((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                    *)psVar1);
  fieldA = (shared_ptr<Field> *)
           std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
           ::end((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                  *)psVar1);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&fieldA);
    if (!bVar2) break;
    local_b8 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_b8);
    std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::set
              ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                *)&__range1_1,
               (set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                *)local_88);
    Field::addGroupDependency
              (peVar3,(set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                       *)&__range1_1);
    std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::~set
              ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                *)&__range1_1);
    std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator++(&__end1);
  }
  __end1_1 = std::
             set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::
             begin((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                    *)local_88);
  fieldB = (shared_ptr<Field> *)
           std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
           ::end((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                  *)local_88);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&fieldB);
    if (!bVar2) break;
    local_108 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator*(&__end1_1);
    peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_108);
    std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::set
              (&local_138,
               (set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                *)&bFields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Field::addGroupDependency(peVar3,&local_138);
    std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::~set
              (&local_138);
    std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator++(&__end1_1);
  }
  std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::~set
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )local_88);
  std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::~set
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )&bFields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void TrainSudoku::addTrainDependencies(
  const std::set<std::pair<int, int>>& a,
  const std::set<std::pair<int, int>>& b)
{
  // Convert coordinate pairs to shared_ptr<Field> for the fields.
  auto toFieldSet = [this](const std::set<std::pair<int, int>>& coords) {
      std::set<std::shared_ptr<Field>, CompareFields> fieldSet;
      for (const auto& coord : coords) {
          fieldSet.insert(fields_[index(coord.first, coord.second)]);
      }
      return fieldSet;
  };

  // Create the field sets for a and b
  auto aFields = toFieldSet(a);
  auto bFields = toFieldSet(b);

  // Add dependencies from a to b
  for (const auto& fieldA : aFields) {
      fieldA->addGroupDependency(bFields);
  }

  // Add dependencies from b to a
  for (const auto& fieldB : bFields) {
      fieldB->addGroupDependency(aFields);
  }
}